

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O3

void mbedtls_ct_zeroize_if(mbedtls_ct_condition_t condition,void *buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (len < 4) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    do {
      *(uint *)((long)buf + uVar2) = *(uint *)((long)buf + uVar2) & ~(uint)condition;
      uVar1 = uVar2 + 4;
      uVar3 = uVar2 + 8;
      uVar2 = uVar1;
    } while (uVar3 <= len);
  }
  if (uVar1 < len) {
    do {
      *(byte *)((long)buf + uVar1) = *(byte *)((long)buf + uVar1) & (byte)~(uint)condition;
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  return;
}

Assistant:

void mbedtls_ct_zeroize_if(mbedtls_ct_condition_t condition, void *buf, size_t len)
{
    uint32_t mask = (uint32_t) ~condition;
    uint8_t *p = (uint8_t *) buf;
    size_t i = 0;
#if defined(MBEDTLS_EFFICIENT_UNALIGNED_ACCESS)
    for (; (i + 4) <= len; i += 4) {
        mbedtls_put_unaligned_uint32((void *) (p + i),
                                     mbedtls_get_unaligned_uint32((void *) (p + i)) & mask);
    }
#endif
    for (; i < len; i++) {
        p[i] = p[i] & mask;
    }
}